

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void lj_dispatch_init_hotcount(global_State *g)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = g[3].gcroot[0xd].gcptr32;
  lVar2 = 0;
  do {
    *(short *)((long)&g[5].strempty.hash + lVar2 * 2) = (short)uVar1 * 2 + -1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void lj_dispatch_init_hotcount(global_State *g)
{
  int32_t hotloop = G2J(g)->param[JIT_P_hotloop];
  HotCount start = (HotCount)(hotloop*HOTCOUNT_LOOP - 1);
  HotCount *hotcount = G2GG(g)->hotcount;
  uint32_t i;
  for (i = 0; i < HOTCOUNT_SIZE; i++)
    hotcount[i] = start;
}